

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

NodeSet * __thiscall
capnp::compiler::NodeTranslator::finish(NodeSet *__return_storage_ptr__,NodeTranslator *this)

{
  Reader source;
  Reader type;
  Builder target;
  UnfinishedValue *pUVar1;
  UnfinishedValue *pUVar2;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  Schema local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  UnfinishedValue *local_28;
  UnfinishedValue *value;
  size_t i;
  NodeTranslator *this_local;
  
  value = (UnfinishedValue *)0x0;
  i = (size_t)this;
  this_local = (NodeTranslator *)__return_storage_ptr__;
  while( true ) {
    pUVar1 = value;
    pUVar2 = (UnfinishedValue *)
             kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::size
                       (&this->unfinishedValues);
    if (pUVar2 <= pUVar1) break;
    local_28 = kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::operator[]
                         (&this->unfinishedValues,(size_t)value);
    memcpy(&local_58,local_28,0x30);
    memcpy(&local_88,&local_28->type,0x30);
    local_90.raw = (local_28->typeScope).raw;
    memcpy(&local_b8,&local_28->target,0x28);
    source._reader.capTable = (CapTableReader *)uStack_50;
    source._reader.segment = (SegmentReader *)local_58;
    source._reader.data = (void *)local_48;
    source._reader.pointers = (WirePointer *)uStack_40;
    source._reader.dataSize = (undefined4)local_38;
    source._reader.pointerCount = local_38._4_2_;
    source._reader._38_2_ = local_38._6_2_;
    source._reader._40_8_ = uStack_30;
    type._reader.capTable = (CapTableReader *)uStack_80;
    type._reader.segment = (SegmentReader *)local_88;
    type._reader.data = (void *)local_78;
    type._reader.pointers = (WirePointer *)uStack_70;
    type._reader.dataSize = (undefined4)local_68;
    type._reader.pointerCount = local_68._4_2_;
    type._reader._38_2_ = local_68._6_2_;
    type._reader._40_8_ = uStack_60;
    target._builder.capTable = (CapTableBuilder *)uStack_b0;
    target._builder.segment = (SegmentBuilder *)local_b8;
    target._builder.data = (void *)local_a8;
    target._builder.pointers = (WirePointer *)uStack_a0;
    target._builder.dataSize = (undefined4)local_98;
    target._builder.pointerCount = local_98._4_2_;
    target._builder._38_2_ = local_98._6_2_;
    compileValue(this,source,type,local_90,target,false);
    value = (UnfinishedValue *)((long)&(value->source)._reader.segment + 1);
  }
  getBootstrapNode(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::NodeSet NodeTranslator::finish() {
  // Careful about iteration here:  compileFinalValue() may actually add more elements to
  // `unfinishedValues`, invalidating iterators in the process.
  for (size_t i = 0; i < unfinishedValues.size(); i++) {
    auto& value = unfinishedValues[i];
    compileValue(value.source, value.type, value.typeScope, value.target, false);
  }

  return getBootstrapNode();
}